

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_profiler.c
# Opt level: O0

SUNErrCode SUNProfiler_End(SUNProfiler p,char *name)

{
  int iVar1;
  SUNHashMap in_RSI;
  long in_RDI;
  sunTimerStruct *timer;
  SUNErrCode ier;
  void **in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (in_RDI == 0) {
    return -9999;
  }
  sunStartTiming((sunTimerStruct *)0x1132a1);
  iVar1 = SUNHashMap_GetValue(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffffe4,
                                                      in_stack_ffffffffffffffe0),
                              in_stack_ffffffffffffffd8);
  if (iVar1 != 0) {
    sunStopTiming((sunTimerStruct *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    if (iVar1 == -1) {
      return -0x26fe;
    }
    if (iVar1 == -2) {
      return -0x26fc;
    }
  }
  sunStopTiming((sunTimerStruct *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
  sunStopTiming((sunTimerStruct *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
  return 0;
}

Assistant:

SUNErrCode SUNProfiler_End(SUNProfiler p, const char* name)
{
  SUNErrCode ier;
  sunTimerStruct* timer;

  if (!p) { return SUN_ERR_ARG_CORRUPT; }

  sunStartTiming(p->overhead);

  ier = SUNHashMap_GetValue(p->map, name, (void**)&timer);
  if (ier)
  {
    sunStopTiming(p->overhead);
    if (ier == -1) { return SUN_ERR_PROFILER_MAPGET; }
    if (ier == -2) { return SUN_ERR_PROFILER_MAPKEYNOTFOUND; }
  }

  sunStopTiming(timer);

  sunStopTiming(p->overhead);
  return SUN_SUCCESS;
}